

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall wallet::LegacyScriptPubKeyMan::SetHDSeed(LegacyScriptPubKeyMan *this,CPubKey *seed)

{
  WalletStorage *pWVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  WalletBatch batch;
  CHDChain newHdChain;
  unique_lock<std::recursive_mutex> local_80;
  undefined1 local_70 [16];
  uchar local_60 [8];
  CHDChain local_58;
  long local_18;
  long *plVar4;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_80._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  local_58.m_next_external_index = 0;
  local_58.m_next_internal_index = 0;
  local_58.nVersion = 2;
  local_58.nExternalChainCounter = 0;
  local_58.nInternalChainCounter = 0;
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  uVar2 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
  local_58.nVersion = (uVar2 & 0xff) + 1;
  CPubKey::GetID((CKeyID *)local_70,seed);
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = local_60[0];
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = local_60[1];
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = local_60[2];
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = local_60[3];
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ =
       SUB84(local_70._0_8_,0);
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._4_4_ =
       SUB84(local_70._0_8_,4);
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._8_4_ =
       SUB84(local_70._8_8_,0);
  local_58.seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._12_4_ =
       SUB84(local_70._8_8_,4);
  AddHDChain(this,&local_58);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0x70))(local_70,plVar4,1);
  local_70._8_8_ = plVar4;
  (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[5])();
  if ((long *)local_70._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 0x28))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::SetHDSeed(const CPubKey& seed)
{
    LOCK(cs_KeyStore);
    // store the keyid (hash160) together with
    // the child index counter in the database
    // as a hdchain object
    CHDChain newHdChain;
    newHdChain.nVersion = m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? CHDChain::VERSION_HD_CHAIN_SPLIT : CHDChain::VERSION_HD_BASE;
    newHdChain.seed_id = seed.GetID();
    AddHDChain(newHdChain);
    NotifyCanGetAddressesChanged();
    WalletBatch batch(m_storage.GetDatabase());
    m_storage.UnsetBlankWalletFlag(batch);
}